

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

ComponentType __thiscall
dxil_spv::Converter::Impl::get_effective_input_output_type(Impl *this,ComponentType type)

{
  bool bVar1;
  Builder *this_00;
  bool local_13;
  ComponentType local_11;
  bool supports_narrow_arith_type;
  ComponentType type_local;
  Impl *this_local;
  
  local_13 = true;
  if (type == F16) {
    local_13 = support_native_fp16_operations(this);
  }
  if ((((this->options).storage_16bit_input_output & 1U) == 0) || (local_13 == false)) {
    local_11 = convert_16bit_component_to_32bit(type);
  }
  else {
    bVar1 = component_type_is_16bit(type);
    local_11 = type;
    if (bVar1) {
      this_00 = builder(this);
      spv::Builder::addCapability(this_00,CapabilityStorageInputOutput16);
    }
  }
  return local_11;
}

Assistant:

DXIL::ComponentType Converter::Impl::get_effective_input_output_type(DXIL::ComponentType type)
{
	bool supports_narrow_arith_type = type != DXIL::ComponentType::F16 || support_native_fp16_operations();
	if (options.storage_16bit_input_output && supports_narrow_arith_type)
	{
		if (component_type_is_16bit(type))
			builder().addCapability(spv::CapabilityStorageInputOutput16);
	}
	else
	{
		// Expand/contract on load/store.
		// The only reasonable way this can break is if application relies on
		// lower precision in interpolation, but I don't think you can rely on that
		// kind of implementation detail ...
		type = convert_16bit_component_to_32bit(type);
	}

	return type;
}